

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O1

int Sfm_TruthToCnf(word Truth,int nVars,Vec_Int_t *vCover,Vec_Str_t *vCnf)

{
  int iVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  byte bVar10;
  char cVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar16;
  word local_58;
  ulong local_50;
  ulong local_48;
  Vec_Int_t *local_40;
  long local_38;
  ulong uVar15;
  
  vCnf->nSize = 0;
  local_58 = Truth;
  if (1 < Truth + 1) {
    uVar14 = (ulong)(uint)nVars;
    if (nVars < 1) {
      __assert_fail("nVars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                    ,0x54,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
    }
    local_50 = (ulong)(uint)(nVars * 2);
    iVar5 = 0;
    lVar7 = 0;
    local_48 = uVar14;
    local_40 = vCover;
    do {
      local_58 = local_58 ^ -lVar7;
      iVar4 = Kit_TruthIsop((uint *)&local_58,(int)uVar14,vCover,0);
      if (iVar4 != 0) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                      ,0x59,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
      }
      iVar4 = vCover->nSize;
      if (0 < iVar4) {
        cVar3 = (char)local_50;
        lVar8 = 0;
        do {
          iVar1 = vCover->pArray[lVar8];
          bVar10 = 0;
          cVar9 = '\0';
          uVar15 = uVar14;
          local_38 = lVar8;
          do {
            switch(iVar1 >> (bVar10 & 0x1f) & 3) {
            case 0:
              goto switchD_004ac293_caseD_0;
            case 1:
              cVar11 = cVar9 * '\x02';
              break;
            case 2:
              cVar11 = bVar10 + 1;
              break;
            case 3:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmCnf.c"
                            ,0x65,"int Sfm_TruthToCnf(word, int, Vec_Int_t *, Vec_Str_t *)");
            }
            uVar13 = vCnf->nCap;
            if (vCnf->nSize == uVar13) {
              if ((int)uVar13 < 0x10) {
                if (vCnf->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(0x10);
                }
                else {
                  pcVar6 = (char *)realloc(vCnf->pArray,0x10);
                }
                vCnf->pArray = pcVar6;
                sVar12 = 0x10;
              }
              else {
                sVar12 = (ulong)uVar13 * 2;
                if ((int)sVar12 <= (int)uVar13) goto LAB_004ac315;
                if (vCnf->pArray == (char *)0x0) {
                  pcVar6 = (char *)malloc(sVar12);
                }
                else {
                  pcVar6 = (char *)realloc(vCnf->pArray,sVar12);
                }
                vCnf->pArray = pcVar6;
              }
              vCnf->nCap = (int)sVar12;
            }
LAB_004ac315:
            iVar2 = vCnf->nSize;
            vCnf->nSize = iVar2 + 1;
            vCnf->pArray[iVar2] = cVar11;
switchD_004ac293_caseD_0:
            vCover = local_40;
            uVar14 = local_48;
            cVar9 = cVar9 + '\x01';
            bVar10 = bVar10 + 2;
            uVar13 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar13;
          } while (uVar13 != 0);
          uVar13 = vCnf->nCap;
          if (vCnf->nSize == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (vCnf->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(vCnf->pArray,0x10);
              }
              vCnf->pArray = pcVar6;
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar13 * 2;
              if ((int)sVar12 <= (int)uVar13) goto LAB_004ac3ae;
              if (vCnf->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar12);
              }
              else {
                pcVar6 = (char *)realloc(vCnf->pArray,sVar12);
              }
              vCnf->pArray = pcVar6;
            }
            vCnf->nCap = (int)sVar12;
          }
LAB_004ac3ae:
          iVar1 = vCnf->nSize;
          vCnf->nSize = iVar1 + 1;
          vCnf->pArray[iVar1] = cVar3 + (char)lVar7;
          uVar13 = vCnf->nCap;
          if (vCnf->nSize == uVar13) {
            if ((int)uVar13 < 0x10) {
              if (vCnf->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(0x10);
              }
              else {
                pcVar6 = (char *)realloc(vCnf->pArray,0x10);
              }
              sVar12 = 0x10;
            }
            else {
              sVar12 = (ulong)uVar13 * 2;
              if ((int)sVar12 <= (int)uVar13) goto LAB_004ac423;
              if (vCnf->pArray == (char *)0x0) {
                pcVar6 = (char *)malloc(sVar12);
              }
              else {
                pcVar6 = (char *)realloc(vCnf->pArray,sVar12);
              }
            }
            vCnf->pArray = pcVar6;
            vCnf->nCap = (int)sVar12;
          }
LAB_004ac423:
          iVar1 = vCnf->nSize;
          vCnf->nSize = iVar1 + 1;
          vCnf->pArray[iVar1] = -1;
          lVar8 = local_38 + 1;
        } while (lVar8 < vCover->nSize);
      }
      iVar5 = iVar5 + iVar4;
      bVar16 = lVar7 != 0;
      lVar7 = lVar7 + 1;
      if (bVar16) {
        return iVar5;
      }
    } while( true );
  }
  if (vCnf->nCap == 0) {
    if (vCnf->pArray == (char *)0x0) {
      pcVar6 = (char *)malloc(0x10);
    }
    else {
      pcVar6 = (char *)realloc(vCnf->pArray,0x10);
    }
    vCnf->pArray = pcVar6;
    vCnf->nCap = 0x10;
  }
  iVar5 = vCnf->nSize;
  vCnf->nSize = iVar5 + 1;
  vCnf->pArray[iVar5] = Truth == 0;
  uVar13 = vCnf->nCap;
  if (vCnf->nSize == uVar13) {
    if ((int)uVar13 < 0x10) {
      if (vCnf->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(0x10);
      }
      else {
        pcVar6 = (char *)realloc(vCnf->pArray,0x10);
      }
      sVar12 = 0x10;
    }
    else {
      sVar12 = (ulong)uVar13 * 2;
      if ((int)sVar12 <= (int)uVar13) goto LAB_004ac4f4;
      if (vCnf->pArray == (char *)0x0) {
        pcVar6 = (char *)malloc(sVar12);
      }
      else {
        pcVar6 = (char *)realloc(vCnf->pArray,sVar12);
      }
    }
    vCnf->pArray = pcVar6;
    vCnf->nCap = (int)sVar12;
  }
LAB_004ac4f4:
  iVar5 = vCnf->nSize;
  vCnf->nSize = iVar5 + 1;
  vCnf->pArray[iVar5] = -1;
  return 1;
}

Assistant:

int Sfm_TruthToCnf( word Truth, int nVars, Vec_Int_t * vCover, Vec_Str_t * vCnf )
{
    Vec_StrClear( vCnf );
    if ( Truth == 0 || ~Truth == 0 )
    {
//        assert( nVars == 0 );
        Vec_StrPush( vCnf, (char)(Truth == 0) );
        Vec_StrPush( vCnf, (char)-1 );
        return 1;
    }
    else 
    {
        int i, k, c, RetValue, Literal, Cube, nCubes = 0;
        assert( nVars > 0 );
        for ( c = 0; c < 2; c ++ )
        {
            Truth = c ? ~Truth : Truth;
            RetValue = Kit_TruthIsop( (unsigned *)&Truth, nVars, vCover, 0 );
            assert( RetValue == 0 );
            nCubes += Vec_IntSize( vCover );
            Vec_IntForEachEntry( vCover, Cube, i )
            {
                for ( k = 0; k < nVars; k++ )
                {
                    Literal = 3 & (Cube >> (k << 1));
                    if ( Literal == 1 )      // '0'  -> pos lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 0) );
                    else if ( Literal == 2 ) // '1'  -> neg lit
                        Vec_StrPush( vCnf, (char)Abc_Var2Lit(k, 1) );
                    else if ( Literal != 0 )
                        assert( 0 );
                }
                Vec_StrPush( vCnf, (char)Abc_Var2Lit(nVars, c) );
                Vec_StrPush( vCnf, (char)-1 );
            }
        }
        return nCubes;
    }
}